

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avilib.cpp
# Opt level: O2

bool avilib::cancel(int32_t nom,int32_t denom,int32_t *out_nom,int32_t *out_denom)

{
  int32_t iVar1;
  
  if ((nom != 0 && denom != 0) && (iVar1 = gcd(nom,denom), iVar1 != 0)) {
    *out_nom = nom / iVar1;
    *out_denom = denom / iVar1;
    return true;
  }
  return false;
}

Assistant:

bool avilib::cancel( int32_t nom, int32_t denom, int32_t &out_nom, int32_t &out_denom )
{
	if( !denom || !nom ) return false;
	int32_t _gcd = gcd( nom, denom );

	if( _gcd ) {
		out_nom = nom / _gcd;
		out_denom = denom / _gcd;
		return true;
	}

	return false;
}